

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceMemoryVkImpl::QueryInterface
          (DeviceMemoryVkImpl *this,INTERFACE_ID *IID,IObject **ppInterface)

{
  bool bVar1;
  
  if (ppInterface == (IObject **)0x0) {
    return;
  }
  bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_DeviceMemoryVk);
  if (bVar1) {
    *ppInterface = (IObject *)this;
    (**(code **)((long)(this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                       .super_ObjectBase<Diligent::IDeviceMemoryVk>.
                       super_RefCountedObject<Diligent::IDeviceMemoryVk>.super_IDeviceMemoryVk.
                       super_IDeviceMemory.super_IDeviceObject + 8))(this);
    return;
  }
  DeviceMemoryBase<Diligent::EngineVkImplTraits>::QueryInterface
            (&this->super_DeviceMemoryBase<Diligent::EngineVkImplTraits>,IID,ppInterface);
  return;
}

Assistant:

Bool DeviceMemoryVkImpl::Resize(Uint64 NewSize)
{
    DvpVerifyResize(NewSize);

    const auto& LogicalDevice = m_pDevice->GetLogicalDevice();
    const auto  NewPageCount  = StaticCast<size_t>(NewSize / m_Desc.PageSize);

    VkMemoryAllocateInfo MemAlloc{};
    MemAlloc.pNext           = nullptr;
    MemAlloc.sType           = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
    MemAlloc.allocationSize  = m_Desc.PageSize;
    MemAlloc.memoryTypeIndex = m_MemoryTypeIndex;

    m_Pages.reserve(NewPageCount);

    while (m_Pages.size() < NewPageCount)
    {
        try
        {
            m_Pages.emplace_back(LogicalDevice.AllocateDeviceMemory(MemAlloc, m_Desc.Name)); // throw on error
        }
        catch (...)
        {
            return false;
        }
    }

    while (m_Pages.size() > NewPageCount)
    {
        m_pDevice->SafeReleaseDeviceObject(std::move(m_Pages.back()), m_Desc.ImmediateContextMask);
        m_Pages.pop_back();
    }

    return true;
}